

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionHandler.h
# Opt level: O0

void __thiscall ExceptionHandler<Client>::handle(ExceptionHandler<Client> *this,Client *client)

{
  undefined8 in_RSI;
  long in_RDI;
  exception *ex;
  
  (**(code **)**(undefined8 **)(in_RDI + 8))(*(undefined8 **)(in_RDI + 8),in_RSI);
  return;
}

Assistant:

void ExceptionHandler<T>::ExceptionHandler::handle(T&& client) {
    try {
        next_handler.handle(std::move(client));
    } catch(std::exception& ex) {
        stream << "Exception: " << ex.what() << std::endl;
    }
}